

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItemLite
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint32 uVar9;
  byte *pbVar10;
  byte *pbVar11;
  string message_data;
  byte *local_a0;
  long local_98;
  byte local_90 [16];
  CodedInputStream local_80;
  
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  uVar8 = 0;
LAB_003898f2:
  do {
    pbVar10 = input->buffer_;
    if (pbVar10 < input->buffer_end_) {
      uVar4 = (uint)*pbVar10;
      if ((char)*pbVar10 < '\0') goto LAB_00389914;
      input->buffer_ = pbVar10 + 1;
    }
    else {
      uVar4 = 0;
LAB_00389914:
      uVar4 = io::CodedInputStream::ReadTagFallback(input,uVar4);
    }
    if ((int)uVar4 < 0x1a) {
      if (uVar4 == 0) goto LAB_00389b1a;
      if (uVar4 == 0xc) {
        uVar8 = 1;
        goto LAB_00389b1c;
      }
      if (uVar4 != 0x10) goto LAB_00389958;
      pbVar10 = input->buffer_;
      if (pbVar10 < input->buffer_end_) {
        bVar1 = *pbVar10;
        uVar8 = (ulong)bVar1;
        uVar9 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003899ae;
        input->buffer_ = pbVar10 + 1;
      }
      else {
        uVar9 = 0;
LAB_003899ae:
        uVar8 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
        if ((long)uVar8 < 0) goto LAB_00389b1a;
      }
      if (local_98 == 0) goto LAB_003898f2;
      local_80.buffer_ = local_a0;
      local_80.total_bytes_read_ = (int)local_98;
      local_80.buffer_end_ = local_a0 + local_80.total_bytes_read_;
      local_80.input_ = (ZeroCopyInputStream *)0x0;
      local_80.overflow_bytes_ = 0;
      local_80.last_tag_ = 0;
      local_80.legitimate_message_end_ = false;
      local_80.aliasing_enabled_ = false;
      local_80.buffer_size_after_limit_ = 0;
      local_80.total_bytes_limit_ = 0x7fffffff;
      local_80.extension_pool_ = (DescriptorPool *)0x0;
      local_80.extension_factory_ = (MessageFactory *)0x0;
      local_80.recursion_budget_ = input->recursion_budget_;
      local_80.current_limit_ = local_80.total_bytes_read_;
      local_80.recursion_limit_ = local_80.recursion_budget_;
      bVar3 = ParseField(this,(int)uVar8 * 8 + 2,&local_80,extension_finder,field_skipper);
      if (!bVar3) {
        io::CodedInputStream::~CodedInputStream(&local_80);
        goto LAB_00389b1a;
      }
      local_98 = 0;
      *local_a0 = 0;
      io::CodedInputStream::~CodedInputStream(&local_80);
      goto LAB_003898f2;
    }
    if (uVar4 == 0x1a) {
      if ((int)uVar8 == 0) break;
      cVar2 = ParseField(this,(int)uVar8 * 8 + 2,input,extension_finder,field_skipper);
    }
    else {
LAB_00389958:
      iVar5 = (*field_skipper->_vptr_FieldSkipper[2])(field_skipper,input,(ulong)uVar4);
      cVar2 = (char)iVar5;
    }
    if (cVar2 == '\0') goto LAB_00389b1a;
  } while( true );
  pbVar10 = input->buffer_;
  if (pbVar10 < input->buffer_end_) {
    bVar1 = *pbVar10;
    uVar8 = (ulong)bVar1;
    uVar9 = (uint32)bVar1;
    if (-1 < (char)bVar1) {
      input->buffer_ = pbVar10 + 1;
      goto LAB_00389a89;
    }
  }
  else {
    uVar9 = 0;
  }
  uVar8 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
  if ((uVar8 & 0x8000000080000000) != 0) {
LAB_00389b1a:
    uVar8 = 0;
    goto LAB_00389b1c;
  }
LAB_00389a89:
  uVar4 = (uint)uVar8;
  iVar5 = 0x1f;
  if ((uVar4 | 1) != 0) {
    for (; (uVar4 | 1) >> iVar5 == 0; iVar5 = iVar5 + -1) {
    }
  }
  bVar1 = (byte)uVar8;
  std::__cxx11::string::resize((ulong)&local_a0,(char)(iVar5 * 9 + 0x49U >> 6) + bVar1);
  if (uVar4 < 0x80) {
    *local_a0 = bVar1;
    pbVar10 = local_a0 + 1;
  }
  else {
    *local_a0 = bVar1 | 0x80;
    uVar8 = uVar8 >> 7 & 0x1ffffff;
    if (uVar4 < 0x4000) {
      local_a0[1] = (byte)uVar8;
      pbVar10 = local_a0 + 2;
    }
    else {
      pbVar10 = local_a0 + 2;
      do {
        pbVar11 = pbVar10;
        uVar6 = (uint)uVar8;
        pbVar11[-1] = (byte)uVar8 | 0x80;
        uVar7 = uVar6 >> 7;
        uVar8 = (ulong)uVar7;
        pbVar10 = pbVar11 + 1;
      } while (0x3fff < uVar6);
      *pbVar11 = (byte)uVar7;
    }
  }
  bVar3 = io::CodedInputStream::ReadRaw(input,pbVar10,uVar4);
  uVar8 = 0;
  if (!bVar3) {
LAB_00389b1c:
    if (local_a0 != local_90) {
      operator_delete(local_a0);
    }
    return SUB81(uVar8,0);
  }
  goto LAB_003898f2;
}

Assistant:

bool ExtensionSet::ParseMessageSetItemLite(io::CodedInputStream* input,
                                           ExtensionFinder* extension_finder,
                                           FieldSkipper* field_skipper) {
  struct MSLite {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      return me->ParseField(
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED + 8 * type_id, input,
          extension_finder, field_skipper);
    }

    bool SkipField(uint32 tag, io::CodedInputStream* input) {
      return field_skipper->SkipField(input, tag);
    }

    ExtensionSet* me;
    ExtensionFinder* extension_finder;
    FieldSkipper* field_skipper;
  };

  return ParseMessageSetItemImpl(input,
                                 MSLite{this, extension_finder, field_skipper});
}